

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void CreateDefaultClassConstructor
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  uint uniqueId;
  TypeClass *classType;
  MemberHandle *pMVar1;
  ScopeData *pSVar2;
  Allocator *allocator;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeFunction *pTVar7;
  TypeRef *contextType;
  SynBase *pSVar8;
  ExprVariableDefinition *pEVar9;
  ExprBase *pEVar10;
  _func_int **pp_Var11;
  VariableData *context;
  ExprVariableDefinition *pEVar12;
  undefined4 extraout_var_03;
  TypeBase *pTVar13;
  IntrusiveList<MemberHandle> *pIVar14;
  char *pcVar15;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr IVar16;
  FunctionData *function;
  IntrusiveList<ExprBase> expressions;
  SmallArray<ArgumentData,_32U> arguments;
  FunctionData *this;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  classType = classDefinition->classType;
  if (classType->extendable == false) {
    pIVar14 = &(classType->super_TypeStruct).members;
    do {
      pMVar1 = pIVar14->head;
      if (pMVar1 == (MemberHandle *)0x0) {
        return;
      }
      pTVar13 = (TypeBase *)&pMVar1->variable->type;
      while ((pTVar13 = (TypeBase *)pTVar13->_vptr_TypeBase, pTVar13 != (TypeBase *)0x0 &&
             (pTVar13->typeID == 0x13))) {
        pTVar13 = pTVar13 + 1;
      }
      if (pMVar1->initializer != (SynBase *)0x0) break;
      bVar4 = HasDefaultConstructor(ctx,source,pTVar13);
      pIVar14 = (IntrusiveList<MemberHandle> *)&pMVar1->next;
    } while (!bVar4);
  }
  bVar4 = RestoreParentTypeScope(ctx,source,(TypeBase *)classType);
  pSVar2 = ctx->scope;
  IVar16 = GetTypeDefaultConstructorName(ctx,classType);
  IVar16 = GetFunctionNameInScope(ctx,pSVar2,(TypeBase *)classType,IVar16,false,false);
  SmallArray<ArgumentData,_32U>::SmallArray(&arguments,ctx->allocator);
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar5),IVar16);
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  this = (FunctionData *)CONCAT44(extraout_var_00,iVar6);
  allocator = ctx->allocator;
  pSVar2 = ctx->scope;
  arguments_00._12_4_ = 0;
  arguments_00.data = arguments.data;
  arguments_00.count = arguments.count;
  pTVar7 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments_00);
  contextType = ExpressionContext::GetReferenceType(ctx,(TypeBase *)classType);
  uniqueId = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uniqueId + 1;
  pcVar15 = (char *)0x0;
  FunctionData::FunctionData
            (this,allocator,source,pSVar2,false,false,false,pTVar7,&contextType->super_TypeBase,
             (SynIdentifier *)CONCAT44(extraout_var,iVar5),(IntrusiveList<MatchData>)ZEXT816(0),
             uniqueId);
  IVar16.end = pcVar15;
  IVar16.begin = (this->name->name).end;
  function = this;
  anon_unknown.dwarf_ff84f::CheckFunctionConflict
            ((anon_unknown_dwarf_ff84f *)ctx,(ExpressionContext *)source,
             (SynBase *)(this->name->name).begin,IVar16);
  ExpressionContext::AddFunction(ctx,this);
  ExpressionContext::PushScope(ctx,this);
  this->functionScope = ctx->scope;
  pSVar8 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  pEVar9 = CreateFunctionContextArgument(ctx,pSVar8,this);
  this->argumentsSize = this->functionScope->dataSize;
  expressions.head = (ExprBase *)0x0;
  expressions.tail = (ExprBase *)0x0;
  CreateDefaultConstructorCode(ctx,source,classType,&expressions);
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar10 = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
  pTVar13 = ctx->typeVoid;
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
  pp_Var11 = (_func_int **)CONCAT44(extraout_var_02,iVar5);
  pTVar3 = ctx->typeVoid;
  *(undefined4 *)(pp_Var11 + 1) = 2;
  pp_Var11[2] = (_func_int *)source;
  pp_Var11[3] = (_func_int *)pTVar3;
  pp_Var11[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var11 + 5) = 0;
  *pp_Var11 = (_func_int *)&PTR__ExprBase_003e3b40;
  pSVar8 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  pSVar8 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar8,this,ctx->scope);
  pEVar10->typeID = 0x1c;
  pEVar10->source = source;
  pEVar10->type = pTVar13;
  pEVar10->next = (ExprBase *)0x0;
  pEVar10->listed = false;
  pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3670;
  pEVar10[1]._vptr_ExprBase = pp_Var11;
  *(undefined8 *)&pEVar10[1].typeID = 0;
  pEVar10[1].source = pSVar8;
  IntrusiveList<ExprBase>::push_back(&expressions,pEVar10);
  ClosePendingUpvalues(ctx,this);
  ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
  if (bVar4) {
    ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  }
  context = CreateFunctionContextVariable(ctx,source,this,(FunctionData *)0x0);
  pEVar12 = CreateFunctionContextVariableDefinition(ctx,source,this,(FunctionData *)0x0,context);
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
  pEVar10 = (ExprBase *)CONCAT44(extraout_var_03,iVar5);
  pTVar7 = this->type;
  pEVar10->typeID = 0x24;
  pEVar10->source = source;
  pEVar10->type = &pTVar7->super_TypeBase;
  pEVar10->next = (ExprBase *)0x0;
  pEVar10->listed = false;
  pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e36a8;
  pEVar10[1]._vptr_ExprBase = (_func_int **)this;
  *(ExprVariableDefinition **)&pEVar10[1].typeID = pEVar9;
  pEVar10[1].source = (SynBase *)0x0;
  pEVar10[1].type = (TypeBase *)0x0;
  pEVar10[1].next = (ExprBase *)0x0;
  *(ExprBase **)&pEVar10[1].listed = expressions.head;
  pEVar10[2]._vptr_ExprBase = (_func_int **)expressions.tail;
  *(ExprVariableDefinition **)&pEVar10[2].typeID = pEVar12;
  pEVar10[2].source = (SynBase *)context;
  this->declaration = pEVar10;
  SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&this->declaration);
  IntrusiveList<ExprBase>::push_back(&classDefinition->functions,this->declaration);
  SmallArray<FunctionData_*,_4U>::push_back(&classType->methods,&function);
  SmallArray<ArgumentData,_32U>::~SmallArray(&arguments);
  return;
}

Assistant:

void CreateDefaultClassConstructor(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	TypeClass *classType = classDefinition->classType;

	// Check if custom default assignment operator is required
	bool customConstructor = false;

	if(classType->extendable)
	{
		customConstructor = true;
	}
	else
	{
		for(MemberHandle *el = classType->members.head; el; el = el->next)
		{
			TypeBase *base = el->variable->type;

			// Find array element type
			while(TypeArray *arrType = getType<TypeArray>(base))
				base = arrType->subType;

			if(el->initializer)
			{
				customConstructor = true;
				break;
			}

			if(HasDefaultConstructor(ctx, source, base))
			{
				customConstructor = true;
				break;
			}
		}
	}

	if(customConstructor)
	{
		bool addedParentScope = RestoreParentTypeScope(ctx, source, classType);

		InplaceStr functionName = GetFunctionNameInScope(ctx, ctx.scope, classType, GetTypeDefaultConstructorName(ctx, classType), false, false);

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(classType), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		CreateDefaultConstructorCode(ctx, source, classType, expressions);

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope)));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		VariableData *contextVariable = CreateFunctionContextVariable(ctx, source, function, NULL);
		ExprVariableDefinition *contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, NULL, contextVariable);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), NULL, expressions, contextVariableDefinition, contextVariable);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);

		classType->methods.push_back(function);
	}
}